

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FSingleLumpFont::CreateFontFromPic(FSingleLumpFont *this,FTextureID picnum)

{
  ulong uVar1;
  FTexture *pFVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  CharData *pCVar7;
  
  pFVar2 = TexMan.Textures.Array[picnum.texnum].Texture;
  uVar1._0_2_ = pFVar2->Width;
  uVar1._2_2_ = pFVar2->Height;
  uVar1._4_2_ = pFVar2->WidthMask;
  uVar1._6_2_ = *(undefined2 *)&pFVar2->field_0x3e;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3._12_2_ = uVar1._6_2_;
  auVar4._8_2_ = uVar1._4_2_;
  auVar4._0_8_ = uVar1;
  auVar4._10_4_ = auVar3._10_4_;
  auVar6._6_8_ = 0;
  auVar6._0_6_ = auVar4._8_6_;
  auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
  auVar5._4_2_ = uVar1._2_2_;
  auVar5._2_2_ = 0;
  auVar5._0_2_ = (undefined2)uVar1;
  (this->super_FFont).SpaceWidth = (int)auVar5._0_8_;
  (this->super_FFont).FontHeight = (int)((ulong)auVar5._0_8_ >> 0x20);
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).FirstChar = 0x41;
  (this->super_FFont).LastChar = 0x41;
  pCVar7 = (CharData *)operator_new__(0x10);
  (this->super_FFont).Chars = pCVar7;
  pCVar7->Pic = pFVar2;
  (this->super_FFont).ActiveColors = 0;
  return;
}

Assistant:

void FSingleLumpFont::CreateFontFromPic (FTextureID picnum)
{
	FTexture *pic = TexMan[picnum];

	FontHeight = pic->GetHeight ();
	SpaceWidth = pic->GetWidth ();
	GlobalKerning = 0;

	FirstChar = LastChar = 'A';
	Chars = new CharData[1];
	Chars->Pic = pic;

	// Only one color range. Don't bother with the others.
	ActiveColors = 0;
}